

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histo.c
# Opt level: O0

int fits_rebin_wcs(fitsfile *fptr,int naxis,float *amin,float *binsize,int *status)

{
  long in_RCX;
  long in_RDX;
  int in_ESI;
  int *in_R8;
  int naxis1;
  int i;
  double binsized [4];
  double amind [4];
  undefined4 in_stack_00000068;
  int local_70;
  int local_6c;
  double local_68 [4];
  double local_48 [4];
  int *local_28;
  long local_20;
  long local_18;
  
  local_28 = in_R8;
  if (*in_R8 == 0) {
    local_70 = 4;
    if (in_ESI < 4) {
      local_70 = in_ESI;
    }
    local_20 = in_RCX;
    local_18 = in_RDX;
    for (local_6c = 0; local_6c < local_70; local_6c = local_6c + 1) {
      local_48[local_6c] = (double)*(float *)(local_18 + (long)local_6c * 4);
      local_68[local_6c] = (double)*(float *)(local_20 + (long)local_6c * 4);
    }
    fits_rebin_wcsd((fitsfile *)CONCAT44(naxis,in_stack_00000068),amin._4_4_,(double *)binsize,
                    (double *)status,(int *)amind[3]);
  }
  return *local_28;
}

Assistant:

int fits_rebin_wcs(
      fitsfile *fptr,   /* I - pointer to table to be binned           */
      int naxis,        /* I - number of axes in the histogram image   */
      float *amin,     /* I - first pixel include in each axis        */
      float *binsize,  /* I - binning factor for each axis            */
      int *status)      
{
  double amind[4], binsized[4];

  /* Copy single precision values into double precision */
  if (*status == 0) {
    int i, naxis1 = 4;
    if (naxis < naxis1) naxis1 = naxis;
    for (i=0; i<naxis1; i++) {
      amind[i] = (double) amin[i];
      binsized[i] = (double) binsize[i];
    }

    fits_rebin_wcsd(fptr, naxis, amind, binsized, status);
  }


  return (*status);
}